

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

VkPipelineShaderStageRequiredSubgroupSizeCreateInfo * __thiscall
Fossilize::StateRecorder::Impl::copy<VkPipelineShaderStageRequiredSubgroupSizeCreateInfo>
          (Impl *this,VkPipelineShaderStageRequiredSubgroupSizeCreateInfo *src,size_t count,
          ScratchAllocator *alloc)

{
  VkPipelineShaderStageRequiredSubgroupSizeCreateInfo *new_data;
  ScratchAllocator *alloc_local;
  size_t count_local;
  VkPipelineShaderStageRequiredSubgroupSizeCreateInfo *src_local;
  Impl *this_local;
  
  if (count == 0) {
    this_local = (Impl *)0x0;
  }
  else {
    this_local = (Impl *)ScratchAllocator::
                         allocate_n<VkPipelineShaderStageRequiredSubgroupSizeCreateInfo>
                                   (alloc,count);
    if (this_local != (Impl *)0x0) {
      std::
      copy<VkPipelineShaderStageRequiredSubgroupSizeCreateInfo_const*,VkPipelineShaderStageRequiredSubgroupSizeCreateInfo*>
                (src,src + count,(VkPipelineShaderStageRequiredSubgroupSizeCreateInfo *)this_local);
    }
  }
  return (VkPipelineShaderStageRequiredSubgroupSizeCreateInfo *)this_local;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}